

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall Statements::evaluate(Statements *this,SymTab *symTab)

{
  pointer ppSVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  bool bVar4;
  Functions *this_00;
  Function *pFVar5;
  Function *function;
  pointer ppSVar6;
  int i;
  ulong uVar7;
  vector<Statement_*,_std::allocator<Statement_*>_> stack;
  Function *local_68;
  vector<Function_*,_std::allocator<Function_*>_> functionStack;
  _Vector_base<Statement_*,_std::allocator<Statement_*>_> local_48;
  
  this_00 = (Functions *)operator_new(0x18);
  (this_00->_functionStack).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_functionStack).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_functionStack).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar1 = (this->_statements).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar6 = (this->_statements).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar6 != ppSVar1; ppSVar6 = ppSVar6 + 1
      ) {
    pFVar5 = (Function *)*ppSVar6;
    if (pFVar5 != (Function *)0x0) {
      if ((pFVar5->super_Statement).isFunction == true) {
        pFVar5 = (Function *)__dynamic_cast(pFVar5,&Statement::typeinfo,&Function::typeinfo,0);
        Functions::addFunction(this_00,pFVar5);
      }
      else {
        std::vector<Function_*,_std::allocator<Function_*>_>::vector
                  ((vector<Function_*,_std::allocator<Function_*>_> *)&stack,
                   (vector<Function_*,_std::allocator<Function_*>_> *)this_00);
        ppSVar3 = stack.super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        ppSVar2 = stack.super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base
                  ((_Vector_base<Function_*,_std::allocator<Function_*>_> *)&stack);
        if (ppSVar2 != ppSVar3) {
          function = (Function *)__dynamic_cast(pFVar5,&Statement::typeinfo,&Function::typeinfo,0);
          bVar4 = Functions::findFunction(this_00,function);
          if (bVar4) {
            pFVar5 = (Function *)__dynamic_cast(pFVar5,&Statement::typeinfo,&Function::typeinfo,0);
            pFVar5 = Functions::returnFunction(this_00,pFVar5);
          }
          stack.super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          stack.super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          stack.super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<Function_*,_std::allocator<Function_*>_>::vector
                    (&functionStack,(vector<Function_*,_std::allocator<Function_*>_> *)this_00);
          for (uVar7 = 0;
              uVar7 < (ulong)((long)functionStack.
                                    super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)functionStack.
                                    super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3);
              uVar7 = uVar7 + 1) {
            local_68 = functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar7];
            std::vector<Statement*,std::allocator<Statement*>>::emplace_back<Statement*>
                      ((vector<Statement*,std::allocator<Statement*>> *)&stack,
                       (Statement **)&local_68);
          }
          std::vector<Statement_*,_std::allocator<Statement_*>_>::vector
                    ((vector<Statement_*,_std::allocator<Statement_*>_> *)&local_48,&stack);
          (*(pFVar5->super_Statement)._vptr_Statement[2])(pFVar5,&local_48);
          std::_Vector_base<Statement_*,_std::allocator<Statement_*>_>::~_Vector_base(&local_48);
          std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base
                    (&functionStack.super__Vector_base<Function_*,_std::allocator<Function_*>_>);
          std::_Vector_base<Statement_*,_std::allocator<Statement_*>_>::~_Vector_base
                    ((_Vector_base<Statement_*,_std::allocator<Statement_*>_> *)&stack);
        }
        (*(pFVar5->super_Statement)._vptr_Statement[1])(pFVar5,symTab);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
    }
  }
  return;
}

Assistant:

void Statements::evaluate(SymTab &symTab) {
    //std::cout << "Evaluating Statements...\n";
    auto *funcs= new Functions();
    for (auto s: _statements) {
        if(s == NULL) continue;
        if(s->isFunction){
            funcs->addFunction(dynamic_cast<Function *>(s));
        } else {
            if(!funcs->getFunctionStack().empty()) {
                if(funcs->findFunction(dynamic_cast<Function *>(s))) {
                    s = funcs->returnFunction(dynamic_cast<Function *>(s));
                }
                std::vector<Statement*>stack;
                std::vector<Function*>functionStack = funcs->getFunctionStack();
                //funcs->setStack(functionStack);
                for(int i = 0; i < functionStack.size();i++){
                    Function *function = functionStack[i];
                    stack.push_back(function);
                }
                s->passStack(stack);
                //s->passFunctions(reinterpret_cast<Statement*>(funcs->returnFunction(dynamic_cast<Function *>(s))));

            }
            s->evaluate(symTab);
            std::cout << std::endl;
        }
    }
}